

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_test.cc
# Opt level: O0

void __thiscall xLearn::AUCMetricTest_auc_test_Test::TestBody(AUCMetricTest_auc_test_Test *this)

{
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  bool bVar1;
  uint uVar2;
  void *pvVar3;
  real_t rVar4;
  real_t rVar5;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  real_t metric_val;
  ThreadPool *pool;
  size_t threadNumber;
  AUCMetric metric;
  vector<float,_std::allocator<float>_> pred;
  float in_stack_000001b8;
  float in_stack_000001bc;
  char *in_stack_000001c0;
  char *in_stack_000001c8;
  vector<float,_std::allocator<float>_> Y;
  AUCMetric *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffe1c;
  AUCMetric *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffe2c;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe30;
  iterator in_stack_fffffffffffffe38;
  iterator threads;
  ThreadPool *this_00;
  AssertHelper local_1b8;
  Message local_1b0;
  string local_1a8 [32];
  AssertionResult local_188;
  AssertHelper local_178;
  Message local_170;
  AssertionResult local_168;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 local_12c;
  undefined4 *local_128;
  undefined8 local_120;
  AssertHelper local_118;
  Message local_110;
  AssertionResult local_108;
  real_t local_f4;
  void *local_f0;
  ulong local_e8;
  undefined1 local_91;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 *local_80;
  undefined8 local_78;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined8 local_28;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffe0;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffe8;
  AUCMetric *in_stack_fffffffffffffff0;
  
  local_40 = 0xbf800000;
  local_3c = 0xbf800000;
  local_38 = 0x3f800000;
  local_34 = 0x3f800000;
  local_30 = (undefined1 *)&stack0xffffffffffffffc0;
  local_28 = 4;
  this_00 = (ThreadPool *)&stack0xffffffffffffffbf;
  std::allocator<float>::allocator((allocator<float> *)0x17e2b9);
  __l_01._M_len = (size_type)this_00;
  __l_01._M_array = in_stack_fffffffffffffe38;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffe30,__l_01,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  std::allocator<float>::~allocator((allocator<float> *)0x17e2ea);
  local_90 = 0x3dcccccd;
  local_8c = 0x3ecccccd;
  local_88 = 0x3eb33333;
  local_84 = 0x3f4ccccd;
  local_80 = &local_90;
  local_78 = 4;
  threads = (iterator)&local_91;
  std::allocator<float>::allocator((allocator<float> *)0x17e344);
  __l_02._M_len = (size_type)this_00;
  __l_02._M_array = threads;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffe30,__l_02,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  std::allocator<float>::~allocator((allocator<float> *)0x17e375);
  AUCMetric::AUCMetric(in_stack_fffffffffffffe20);
  uVar2 = std::thread::hardware_concurrency();
  local_e8 = (ulong)uVar2;
  pvVar3 = operator_new(0x120);
  ThreadPool::ThreadPool(this_00,(size_t)threads);
  local_f0 = pvVar3;
  Metric::Initialize((Metric *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (ThreadPool *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  AUCMetric::Accumulate
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  rVar4 = AUCMetric::GetMetric((AUCMetric *)this_00);
  local_f4 = rVar4;
  testing::internal::CmpHelperFloatingPointEQ<float>
            (in_stack_000001c8,in_stack_000001c0,in_stack_000001bc,in_stack_000001b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
  uVar7 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe28);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    in_stack_fffffffffffffe20 =
         (AUCMetric *)testing::AssertionResult::failure_message((AssertionResult *)0x17e548);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric_test.cc"
               ,0xac,(char *)in_stack_fffffffffffffe20);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    testing::Message::~Message((Message *)0x17e5a5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17e5fd);
  AUCMetric::Reset(in_stack_fffffffffffffe00);
  local_138 = 0xbf800000;
  local_134 = 0xbf800000;
  local_130 = 0x3f800000;
  local_12c = 0x3f800000;
  local_128 = &local_138;
  local_120 = 4;
  __l._M_array._4_4_ = in_stack_fffffffffffffe1c;
  __l._M_array._0_4_ = in_stack_fffffffffffffe18;
  __l._M_len = (size_type)in_stack_fffffffffffffe20;
  std::vector<float,_std::allocator<float>_>::operator=(in_stack_fffffffffffffe10,__l);
  __l_00._M_array._4_4_ = in_stack_fffffffffffffe1c;
  __l_00._M_array._0_4_ = in_stack_fffffffffffffe18;
  __l_00._M_len = (size_type)in_stack_fffffffffffffe20;
  std::vector<float,_std::allocator<float>_>::operator=(in_stack_fffffffffffffe10,__l_00);
  AUCMetric::Accumulate
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  rVar5 = AUCMetric::GetMetric((AUCMetric *)this_00);
  local_f4 = rVar5;
  testing::internal::CmpHelperFloatingPointEQ<float>
            (in_stack_000001c8,in_stack_000001c0,in_stack_000001bc,in_stack_000001b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_168);
  uVar6 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe18);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    in_stack_fffffffffffffe10 =
         (vector<float,_std::allocator<float>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x17e7b4);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric_test.cc"
               ,0xb2,(char *)in_stack_fffffffffffffe10);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message((Message *)0x17e811);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17e866);
  AUCMetric::metric_type_abi_cxx11_((AUCMetric *)CONCAT44(rVar4,uVar7));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[4]>
            ((char *)CONCAT44(rVar5,uVar6),(char *)in_stack_fffffffffffffe10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (char (*) [4])in_stack_fffffffffffffe00);
  std::__cxx11::string::~string(local_1a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    in_stack_fffffffffffffe00 =
         (AUCMetric *)testing::AssertionResult::failure_message((AssertionResult *)0x17e936);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric_test.cc"
               ,0xb3,(char *)in_stack_fffffffffffffe00);
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    testing::Message::~Message((Message *)0x17e984);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17e9d3);
  AUCMetric::~AUCMetric(in_stack_fffffffffffffe00);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffe10);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffe10);
  return;
}

Assistant:

TEST(AUCMetricTest, auc_test) {
  std::vector<real_t> Y = {-1.0, -1.0, 1.0, 1.0};
  std::vector<real_t> pred = {0.1, 0.4, 0.35, 0.8};
  AUCMetric metric;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  metric.Initialize(pool);
  metric.Accumulate(Y, pred);
  real_t metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, 0.75);
  metric.Reset();
  Y = {-1.0, -1.0, 1.0, 1.0};
  pred = {0.1, 0.4, 0.35, 0.8};
  metric.Accumulate(Y, pred);
  metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, 0.75);
  EXPECT_EQ(metric.metric_type(), "AUC");
}